

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O2

void ssh2_rportfwd_remove(ConnectionLayer *cl,ssh_rportfwd *rpf)

{
  BinarySink *bs;
  long lVar1;
  ssh_rportfwd *psVar2;
  
  if (rpf->share_ctx == (ssh_sharing_connstate *)0x0) {
    lVar1 = (**(code **)((cl[1].vt)->rportfwd_alloc + 0x18))(0x50);
    bs = (BinarySink *)(lVar1 + 0x60);
    BinarySink_put_stringz(bs,"cancel-tcpip-forward");
    BinarySink_put_bool(bs,false);
    BinarySink_put_stringz(bs,rpf->shost);
    BinarySink_put_uint32(bs,(ulong)rpf->sport);
    pq_base_push((PacketQueueBase *)cl[2].vt,(PacketQueueNode *)(lVar1 + 0x40));
  }
  if (cl[-6].logctx != (LogContext *)0x0) {
    psVar2 = (ssh_rportfwd *)del234((tree234 *)cl[-6].logctx,rpf);
    if (psVar2 == rpf) {
      free_rportfwd(rpf);
      return;
    }
    __assert_fail("realpf == rpf",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2-client.c"
                  ,0x12a,"void ssh2_rportfwd_remove(ConnectionLayer *, struct ssh_rportfwd *)");
  }
  __assert_fail("s->rportfwds",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2-client.c"
                ,0x128,"void ssh2_rportfwd_remove(ConnectionLayer *, struct ssh_rportfwd *)");
}

Assistant:

void ssh2_rportfwd_remove(ConnectionLayer *cl, struct ssh_rportfwd *rpf)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);

    if (rpf->share_ctx) {
        /*
         * We don't manufacture a cancel-tcpip-forward message for
         * remote port forwardings being removed on behalf of a
         * downstream; we just pass through the one the downstream
         * sent to us.
         */
    } else {
        PktOut *pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, SSH2_MSG_GLOBAL_REQUEST);
        put_stringz(pktout, "cancel-tcpip-forward");
        put_bool(pktout, false);           /* _don't_ want reply */
        put_stringz(pktout, rpf->shost);
        put_uint32(pktout, rpf->sport);
        pq_push(s->ppl.out_pq, pktout);
    }

    assert(s->rportfwds);
    struct ssh_rportfwd *realpf = del234(s->rportfwds, rpf);
    assert(realpf == rpf);
    free_rportfwd(rpf);
}